

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O2

string * __thiscall
OnDiskDataset::get_id_abi_cxx11_(string *__return_storage_ptr__,OnDiskDataset *this)

{
  DatabaseName dbname;
  path pStack_f8;
  undefined1 local_b8 [160];
  
  std::experimental::filesystem::v1::__cxx11::path::path(&pStack_f8,&this->db_base);
  DatabaseName::parse((DatabaseName *)local_b8,&pStack_f8,&this->name);
  std::experimental::filesystem::v1::__cxx11::path::~path(&pStack_f8);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_b8 + 0x60));
  DatabaseName::~DatabaseName((DatabaseName *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string OnDiskDataset::get_id() const {
    // TODO(unknown): use DatabaseName as a class member instead
    auto dbname = DatabaseName::parse(db_base, name);
    return dbname.get_id();
}